

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crypt.cpp
# Opt level: O2

char * __thiscall Crypt::crypt(Crypt *this,char *__key,char *__salt)

{
  DES c2;
  DESinv d;
  DES c1;
  SequenceD<64> local_4e0;
  SequenceD<64> local_430;
  SequenceD<64> local_380;
  SequenceD<64> local_2d0;
  SequenceD<64> local_220;
  SequenceD<64> local_170;
  SequenceD<64> local_c0;
  
  SequenceD<64>::SequenceD(&local_c0,&this->m_k1);
  SequenceD<64>::SequenceD(&local_170,(SequenceD<64> *)__key);
  DES::operator()(&local_430,(DES *)&local_c0,&local_170);
  SequenceD<64>::operator=((SequenceD<64> *)__key,&local_430);
  SequenceD<64>::~SequenceD(&local_430);
  SequenceD<64>::~SequenceD(&local_170);
  SequenceD<64>::SequenceD(&local_430,&this->m_k2);
  SequenceD<64>::SequenceD(&local_220,(SequenceD<64> *)__key);
  DESinv::operator()(&local_4e0,(DESinv *)&local_430,&local_220);
  SequenceD<64>::operator=((SequenceD<64> *)__key,&local_4e0);
  SequenceD<64>::~SequenceD(&local_4e0);
  SequenceD<64>::~SequenceD(&local_220);
  SequenceD<64>::SequenceD(&local_4e0,&this->m_k1);
  SequenceD<64>::SequenceD(&local_380,(SequenceD<64> *)__key);
  DES::operator()(&local_2d0,(DES *)&local_4e0,&local_380);
  SequenceD<64>::operator=((SequenceD<64> *)__key,&local_2d0);
  SequenceD<64>::~SequenceD(&local_2d0);
  SequenceD<64>::~SequenceD(&local_380);
  SequenceD<64>::~SequenceD(&local_4e0);
  SequenceD<64>::~SequenceD(&local_430);
  SequenceD<64>::~SequenceD(&local_c0);
  return __key;
}

Assistant:

SequenceD<64> &Crypt::crypt(SequenceD<64> &seq) {
    DES c1(m_k1);
    seq = c1(seq);
    DESinv d(m_k2);
    seq = d(seq);
    DES c2(m_k1);
    seq = c2(seq);
    return seq;
}